

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedChargeAdapter.cpp
# Opt level: O2

FixedChargeAtypeParameters __thiscall
OpenMD::FixedChargeAdapter::getFixedChargeParam(FixedChargeAdapter *this)

{
  _func_int **pp_Var1;
  bool bVar2;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::FixedChargeAtypeParameters>_> fcData;
  shared_ptr<OpenMD::GenericData> data;
  shared_ptr<OpenMD::GenericData> local_60;
  undefined1 local_50 [16];
  string local_40;
  
  bVar2 = isFixedCharge(this);
  if (!bVar2) {
    AtomType::getName_abi_cxx11_(&local_40,this->at_);
    snprintf(painCave.errMsg,2000,
             "FixedChargeAdapter::getFixedChargeParam was passed an atomType (%s)\n\tthat does not appear to be a fixed charge atom.\n"
             ,local_40._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_40);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)local_50,(string *)this->at_);
  if ((_func_int **)local_50._0_8_ == (_func_int **)0x0) {
    AtomType::getName_abi_cxx11_(&local_40,this->at_);
    snprintf(painCave.errMsg,2000,
             "FixedChargeAdapter::getFixedChargeParam could not find fixed charge\n\tparameters for atomType %s.\n"
             ,local_40._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_40);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  std::
  dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::FixedChargeAtypeParameters>,OpenMD::GenericData>
            (&local_60);
  if (local_60.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    AtomType::getName_abi_cxx11_(&local_40,this->at_);
    snprintf(painCave.errMsg,2000,
             "FixedChargeAdapter::getFixedChargeParam could not convert\n\tGenericData to FixedChargeAtypeData for atom type %s\n"
             ,local_40._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_40);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  pp_Var1 = local_60.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
            _vptr_GenericData;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_60.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  return (FixedChargeAtypeParameters)(RealType)pp_Var1;
}

Assistant:

FixedChargeAtypeParameters FixedChargeAdapter::getFixedChargeParam() {
    if (!isFixedCharge()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "FixedChargeAdapter::getFixedChargeParam was passed an atomType "
               "(%s)\n"
               "\tthat does not appear to be a fixed charge atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(FCtypeID);
    if (data == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "FixedChargeAdapter::getFixedChargeParam could not find fixed "
               "charge\n"
               "\tparameters for atomType %s.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<FixedChargeAtypeData> fcData =
        std::dynamic_pointer_cast<FixedChargeAtypeData>(data);
    if (fcData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "FixedChargeAdapter::getFixedChargeParam could not convert\n"
               "\tGenericData to FixedChargeAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return fcData->getData();
  }